

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  Printer *pPVar2;
  bool bVar3;
  int iVar4;
  FileDescriptor *pFVar5;
  ulong uVar6;
  size_type sVar7;
  reference ppFVar8;
  FieldGenerator *pFVar9;
  OneofDescriptor *this_00;
  string *value1;
  size_t sVar10;
  int i_00;
  int i_01;
  string local_80;
  uint local_60;
  int i_2;
  string local_50;
  uint local_2c;
  FieldDescriptor *pFStack_28;
  int i_1;
  FieldDescriptor *field;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  bVar3 = SupportsArenas(this->descriptor_);
  if (bVar3) {
    io::Printer::Print(pPStack_18,
                       "void $classname$::Swap($classname$* other) {\n  if (other == this) return;\n  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {\n    InternalSwap(other);\n  } else {\n    $classname$* temp = New(GetArenaNoVirtual());\n    temp->MergeFrom(*other);\n    other->CopyFrom(*this);\n    InternalSwap(temp);\n    if (GetArenaNoVirtual() == NULL) {\n      delete temp;\n    }\n  }\n}\nvoid $classname$::UnsafeArenaSwap($classname$* other) {\n  if (other == this) return;\n  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());\n  InternalSwap(other);\n}\n"
                       ,"classname",&this->classname_);
  }
  else {
    io::Printer::Print(pPStack_18,
                       "void $classname$::Swap($classname$* other) {\n  if (other == this) return;\n  InternalSwap(other);\n}\n"
                       ,"classname",&this->classname_);
  }
  io::Printer::Print(pPStack_18,"void $classname$::InternalSwap($classname$* other) {\n","classname"
                     ,&this->classname_);
  io::Printer::Indent(pPStack_18);
  pFVar5 = Descriptor::file(this->descriptor_);
  bVar3 = HasGeneratedMethods(pFVar5,&this->options_);
  if (bVar3) {
    for (field._4_4_ = 0; uVar6 = (ulong)field._4_4_,
        sVar7 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(&this->optimized_order_), uVar6 < sVar7; field._4_4_ = field._4_4_ + 1) {
      ppFVar8 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&this->optimized_order_,(long)field._4_4_);
      pFStack_28 = *ppFVar8;
      pFVar9 = FieldGeneratorMap::get(&this->field_generators_,pFStack_28);
      (*pFVar9->_vptr_FieldGenerator[0xd])(pFVar9,pPStack_18);
    }
    for (local_2c = 0; uVar1 = local_2c, iVar4 = Descriptor::oneof_decl_count(this->descriptor_),
        pPVar2 = pPStack_18, (int)uVar1 < iVar4; local_2c = local_2c + 1) {
      this_00 = Descriptor::oneof_decl(this->descriptor_,local_2c);
      value1 = OneofDescriptor::name_abi_cxx11_(this_00);
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)local_2c,i_00);
      io::Printer::Print(pPVar2,
                         "std::swap($oneof_name$_, other->$oneof_name$_);\nstd::swap(_oneof_case_[$i$], other->_oneof_case_[$i$]);\n"
                         ,"oneof_name",value1,"i",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    pFVar5 = Descriptor::file(this->descriptor_);
    bVar3 = HasFieldPresence(pFVar5);
    if (bVar3) {
      for (local_60 = 0; uVar6 = (ulong)(int)local_60, sVar10 = HasBitsSize(this),
          pPVar2 = pPStack_18, uVar6 < sVar10 >> 2; local_60 = local_60 + 1) {
        SimpleItoa_abi_cxx11_(&local_80,(protobuf *)(ulong)local_60,i_01);
        io::Printer::Print(pPVar2,"std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n","i",
                           &local_80);
        std::__cxx11::string::~string((string *)&local_80);
      }
    }
    bVar3 = PreserveUnknownFields(this->descriptor_);
    if (bVar3) {
      io::Printer::Print(pPStack_18,"_internal_metadata_.Swap(&other->_internal_metadata_);\n");
    }
    io::Printer::Print(pPStack_18,"std::swap(_cached_size_, other->_cached_size_);\n");
    iVar4 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar4) {
      io::Printer::Print(pPStack_18,"_extensions_.Swap(&other->_extensions_);\n");
    }
    if (this->num_weak_fields_ != 0) {
      io::Printer::Print(pPStack_18,"_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n")
      ;
    }
  }
  else {
    io::Printer::Print(pPStack_18,"GetReflection()->Swap(this, other);");
  }
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print(pPStack_18,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSwap(io::Printer* printer) {
  if (SupportsArenas(descriptor_)) {
    // Generate the Swap member function. This is a lightweight wrapper around
    // UnsafeArenaSwap() / MergeFrom() with temporaries, depending on the memory
    // ownership situation: swapping across arenas or between an arena and a
    // heap requires copying.
    printer->Print(
        "void $classname$::Swap($classname$* other) {\n"
        "  if (other == this) return;\n"
        "  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {\n"
        "    InternalSwap(other);\n"
        "  } else {\n"
        "    $classname$* temp = New(GetArenaNoVirtual());\n"
        "    temp->MergeFrom(*other);\n"
        "    other->CopyFrom(*this);\n"
        "    InternalSwap(temp);\n"
        "    if (GetArenaNoVirtual() == NULL) {\n"
        "      delete temp;\n"
        "    }\n"
        "  }\n"
        "}\n"
        "void $classname$::UnsafeArenaSwap($classname$* other) {\n"
        "  if (other == this) return;\n"
        "  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());\n"
        "  InternalSwap(other);\n"
        "}\n",
        "classname", classname_);
  } else {
    printer->Print(
        "void $classname$::Swap($classname$* other) {\n"
        "  if (other == this) return;\n"
        "  InternalSwap(other);\n"
        "}\n",
        "classname", classname_);
  }

  // Generate the UnsafeArenaSwap member function.
  printer->Print("void $classname$::InternalSwap($classname$* other) {\n",
                 "classname", classname_);
  printer->Indent();

  if (HasGeneratedMethods(descriptor_->file(), options_)) {
    for (int i = 0; i < optimized_order_.size(); i++) {
      // optimized_order_ does not contain oneof fields, but the field
      // generators for these fields do not emit swapping code on their own.
      const FieldDescriptor* field = optimized_order_[i];
      field_generators_.get(field).GenerateSwappingCode(printer);
    }

    for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
      printer->Print(
        "std::swap($oneof_name$_, other->$oneof_name$_);\n"
        "std::swap(_oneof_case_[$i$], other->_oneof_case_[$i$]);\n",
        "oneof_name", descriptor_->oneof_decl(i)->name(),
        "i", SimpleItoa(i));
    }

    if (HasFieldPresence(descriptor_->file())) {
      for (int i = 0; i < HasBitsSize() / 4; ++i) {
        printer->Print("std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n",
                       "i", SimpleItoa(i));
      }
    }

    if (PreserveUnknownFields(descriptor_)) {
      printer->Print("_internal_metadata_.Swap(&other->_internal_metadata_);\n");
    }

    printer->Print("std::swap(_cached_size_, other->_cached_size_);\n");
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("_extensions_.Swap(&other->_extensions_);\n");
    }
    if (num_weak_fields_) {
      printer->Print(
          "_weak_field_map_.UnsafeArenaSwap(&other->_weak_field_map_);\n");
    }
  } else {
    printer->Print("GetReflection()->Swap(this, other);");
  }

  printer->Outdent();
  printer->Print("}\n");
}